

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidgetItem::QTableWidgetItem(QTableWidgetItem *this,QTableWidgetItem *other)

{
  QTableWidgetItemPrivate *pQVar1;
  
  this->_vptr_QTableWidgetItem = (_func_int **)&PTR__QTableWidgetItem_007e95a0;
  this->rtti = 0;
  QArrayDataPointer<QWidgetItemData>::QArrayDataPointer(&(this->values).d,&(other->values).d);
  this->view = (QTableWidget *)0x0;
  pQVar1 = (QTableWidgetItemPrivate *)operator_new(0x10);
  pQVar1->q = this;
  pQVar1->id = -1;
  pQVar1->headerItem = false;
  this->d = pQVar1;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       (other->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
       super_QFlagsStorage<Qt::ItemFlag>.i;
  return;
}

Assistant:

QTableWidgetItem::QTableWidgetItem(const QTableWidgetItem &other)
    : rtti(Type), values(other.values), view(nullptr),
      d(new QTableWidgetItemPrivate(this)),
      itemFlags(other.itemFlags)
{
}